

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_order_segments(REF_INT n,REF_INT *c2n,REF_INT *order)

{
  bool bVar1;
  bool bVar2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_BOOL loop;
  REF_BOOL found;
  REF_INT first_cell;
  REF_INT j;
  REF_INT i;
  REF_INT *order_local;
  REF_INT *c2n_local;
  REF_INT n_local;
  
  if (n != 0) {
    loop = -1;
    for (first_cell = 0; first_cell < n; first_cell = first_cell + 1) {
      bVar2 = false;
      for (found = 0; found < n; found = found + 1) {
        if (c2n[first_cell << 1] == c2n[found * 2 + 1]) {
          bVar2 = true;
          break;
        }
      }
      if (!bVar2) {
        loop = first_cell;
        break;
      }
    }
    bVar2 = loop == -1;
    if (bVar2) {
      loop = 0;
    }
    *order = loop;
    for (first_cell = 1; first_cell < n; first_cell = first_cell + 1) {
      bVar1 = false;
      for (found = 0; found < n; found = found + 1) {
        if (c2n[order[first_cell + -1] * 2 + 1] == c2n[found << 1]) {
          order[first_cell] = found;
          bVar1 = true;
          break;
        }
      }
      if (!bVar1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0xb03,"ref_export_order_segments","next segment not found");
        return 1;
      }
    }
    if (bVar2) {
      if ((long)c2n[*order << 1] != (long)c2n[order[n + -1] * 2 + 1]) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0xb08,"ref_export_order_segments","first and last do not match for loop",
               (long)c2n[*order << 1],(long)c2n[order[n + -1] * 2 + 1]);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_export_order_segments(REF_INT n, REF_INT *c2n,
                                             REF_INT *order) {
  REF_INT i, j, first_cell;
  REF_BOOL found, loop;

  if (0 == n) return REF_SUCCESS;

  first_cell = REF_EMPTY;
  for (i = 0; i < n; i++) {
    found = REF_FALSE;
    for (j = 0; j < n; j++) {
      if (c2n[0 + 2 * i] == c2n[1 + 2 * j]) {
        found = REF_TRUE;
        break;
      }
    }
    if (!found) {
      first_cell = i;
      break;
    }
  }

  /* arbitrary for loops */
  loop = REF_FALSE;
  if (REF_EMPTY == first_cell) {
    loop = REF_TRUE;
    first_cell = 0;
  }

  order[0] = first_cell;
  for (i = 1; i < n; i++) {
    found = REF_FALSE;
    for (j = 0; j < n; j++) {
      if (c2n[1 + 2 * order[i - 1]] == c2n[0 + 2 * j]) {
        order[i] = j;
        found = REF_TRUE;
        break;
      }
    }
    RAS(found, "next segment not found");
  }

  if (loop)
    REIS(c2n[0 + 2 * order[0]], c2n[1 + 2 * order[n - 1]],
         "first and last do not match for loop");

  return REF_SUCCESS;
}